

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.hpp
# Opt level: O2

void __thiscall
tf::
Pipeline<tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/pipeline.cpp:34:36)>,_tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/pipeline.cpp:46:38)>,_tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/pipeline.cpp:55:36)>_>
::_on_pipe(Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_pipeline_cpp:34:36)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_pipeline_cpp:46:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_pipeline_cpp:55:36)>_>
           *this,Pipeflow *pf,Runtime *rt)

{
  long *plVar1;
  size_t sVar2;
  char *__format;
  long lStack_20;
  
  sVar2 = pf->_pipe;
  if (sVar2 == 2) {
    __format = "stage 3: input buffer[%zu] = %zu\n";
    lStack_20 = 8;
  }
  else {
    if (sVar2 != 1) {
      if (sVar2 != 0) {
        return;
      }
      if (pf->_token != 5) {
        printf("stage 1: input token = %zu\n");
        ((this->_pipes).
         super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_pipeline_cpp:34:36)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_pipeline_cpp:46:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_pipeline_cpp:55:36)>_>
         .
         super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_pipeline_cpp:34:36)>,_false>
         ._M_head_impl._callable.buffer)->_M_elems[pf->_line] = pf->_token;
        return;
      }
      Pipeflow::stop(pf);
      return;
    }
    __format = "stage 2: input buffer[%zu] = %zu\n";
    lStack_20 = 0x18;
  }
  printf(__format,pf->_line,
         *(undefined8 *)
          (*(long *)((long)&(((tuple<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_pipeline_cpp:34:36)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_pipeline_cpp:46:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_pipeline_cpp:55:36)>_>
                               *)(&this->_meta + -4))->
                            super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_pipeline_cpp:34:36)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_pipeline_cpp:46:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_pipeline_cpp:55:36)>_>
                            ).
                            super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_pipeline_cpp:46:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_pipeline_cpp:55:36)>_>
                            .
                            super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_pipeline_cpp:55:36)>_>
                            .
                            super__Head_base<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_pipeline_cpp:55:36)>,_false>
                            ._M_head_impl._type + lStack_20) + pf->_line * 8));
  plVar1 = (long *)(*(long *)((long)&(((tuple<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_pipeline_cpp:34:36)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_pipeline_cpp:46:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_pipeline_cpp:55:36)>_>
                                        *)(&this->_meta + -4))->
                                     super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_pipeline_cpp:34:36)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_pipeline_cpp:46:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_pipeline_cpp:55:36)>_>
                                     ).
                                     super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_pipeline_cpp:46:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_pipeline_cpp:55:36)>_>
                                     .
                                     super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_pipeline_cpp:55:36)>_>
                                     .
                                     super__Head_base<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_pipeline_cpp:55:36)>,_false>
                                     ._M_head_impl._type + lStack_20) + pf->_line * 8);
  *plVar1 = *plVar1 + 1;
  return;
}

Assistant:

void Pipeline<Ps...>::_on_pipe(Pipeflow& pf, Runtime& rt) {
  visit_tuple([&](auto&& pipe){
    using callable_t = typename std::decay_t<decltype(pipe)>::callable_t;
    if constexpr (std::is_invocable_v<callable_t, Pipeflow&>) {
      pipe._callable(pf);
    }
    else if constexpr(std::is_invocable_v<callable_t, Pipeflow&, Runtime&>) {
      pipe._callable(pf, rt);
    }
    else {
      static_assert(dependent_false_v<callable_t>, "un-supported pipe callable type");
    }
  }, _pipes, pf._pipe);
}